

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionBegStr.cpp
# Opt level: O0

int __thiscall
Hpipe::InstructionBegStr::clone
          (InstructionBegStr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Context *this_00;
  CharItem **val;
  InstructionBegStr *this_01;
  InstructionNone *this_02;
  Context local_b8;
  int local_34;
  undefined8 uStack_30;
  int ind;
  Vec<unsigned_int> *keep_ind_local;
  Context *ncx_local;
  PtrPool<Hpipe::Instruction,_32> *inst_pool_local;
  InstructionBegStr *this_local;
  
  uStack_30 = ___flags;
  keep_ind_local = (Vec<unsigned_int> *)__child_stack;
  ncx_local = (Context *)__fn;
  inst_pool_local = (PtrPool<Hpipe::Instruction,_32> *)this;
  val = Vec<const_Hpipe::CharItem_*>::operator[]
                  (&(this->super_InstructionWithCode).super_Instruction.cx.pos,
                   *(uint *)&(this->super_InstructionWithCode).super_Instruction.field_0x174);
  local_34 = Vec<const_Hpipe::CharItem_*>::index_first
                       ((Vec<const_Hpipe::CharItem_*> *)__child_stack,val);
  this_00 = ncx_local;
  if (local_34 < 0) {
    this_02 = (InstructionNone *)operator_new(0x178);
    Context::Context(&local_b8,(Context *)keep_ind_local);
    InstructionNone::Instruction(this_02,&local_b8);
    this_local = (InstructionBegStr *)
                 PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)this_00,this_02);
    Context::~Context(&local_b8);
  }
  else {
    this_01 = (InstructionBegStr *)operator_new(0x1b0);
    InstructionBegStr(this_01,(Context *)keep_ind_local,&this->var,local_34,
                      (bool)(this->want_next_char & 1));
    this_local = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)this_00,this_01);
  }
  return (int)this_local;
}

Assistant:

Instruction *InstructionBegStr::clone( PtrPool<Instruction> &inst_pool, const Context &ncx, const Vec<unsigned> &keep_ind ) {
    int ind = ncx.pos.index_first( cx.pos[ num_active_item ] );
    if ( ind >= 0 )
        return inst_pool << new InstructionBegStr( ncx, var, ind, want_next_char );
    return inst_pool << new InstructionNone( ncx );
}